

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

size_t __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::GetEmptyHeapBlockCount
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  undefined4 *puVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  
  pSVar5 = this->emptyBlockList;
  if (pSVar5 == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar3 = 1;
    do {
      uVar6 = uVar3;
      this_00 = (pSVar5->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
                super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar5 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&this_00->super_HeapBlock);
      uVar3 = uVar6 + 1;
    } while (pSVar5 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0
            );
  }
  if (uVar6 != (this->super_HeapBucket).emptyHeapBlockCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1d6,"(count == this->emptyHeapBlockCount)",
                       "count == this->emptyHeapBlockCount");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return uVar6;
}

Assistant:

size_t
HeapBucketT<TBlockType>::GetEmptyHeapBlockCount() const
{
    size_t count = HeapBlockList::Count(this->emptyBlockList);
    RECYCLER_SLOW_CHECK(Assert(count == this->emptyHeapBlockCount));
    return count;
}